

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_delete_all(planck_unit_test_t *tc)

{
  int iVar1;
  uint uVar2;
  int local_a0;
  uint local_9c;
  uint local_98;
  int local_94;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_edge_cases);
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    local_94 = iVar1;
    bhdct_delete(tc,&dict,&local_94,'\0',1,'\x01');
  }
  for (uVar2 = 0x32; uVar2 < 100; uVar2 = uVar2 + 2) {
    local_98 = uVar2;
    bhdct_delete(tc,&dict,&local_98,'\0',1,'\x01');
  }
  for (uVar2 = 500; uVar2 < 1000; uVar2 = uVar2 + 5) {
    local_9c = uVar2;
    bhdct_delete(tc,&dict,&local_9c,'\0',1,'\x01');
  }
  for (iVar1 = -100; iVar1 < -0x32; iVar1 = iVar1 + 2) {
    local_a0 = iVar1;
    bhdct_delete(tc,&dict,&local_a0,'\0',1,'\x01');
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_delete_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}